

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O0

int Gia_ManCheckUnate_rec(Gia_Man_t *p,int iObj)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  uint local_48;
  uint local_44;
  int Res1;
  int Res0;
  Gia_Obj_t *pObj;
  int iObj_local;
  Gia_Man_t *p_local;
  
  if (p->nTravIds - p->pTravIds[iObj] < 4) {
    p_local._4_4_ = p->nTravIds - p->pTravIds[iObj];
  }
  else {
    pObj_00 = Gia_ManObj(p,iObj);
    p->pTravIds[iObj] = p->nTravIds + -3;
    iVar1 = Gia_ObjIsCi(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
      local_44 = Gia_ManCheckUnate_rec(p,iVar1);
      iVar1 = Gia_ObjFaninId1(pObj_00,iObj);
      local_48 = Gia_ManCheckUnate_rec(p,iVar1);
      if (((local_44 == 1) || (local_44 == 2)) && (iVar1 = Gia_ObjFaninC0(pObj_00), iVar1 != 0)) {
        local_44 = local_44 ^ 3;
      }
      if (((local_48 == 1) || (local_48 == 2)) && (iVar1 = Gia_ObjFaninC1(pObj_00), iVar1 != 0)) {
        local_48 = local_48 ^ 3;
      }
      p->pTravIds[iObj] = p->nTravIds - (local_44 & local_48);
      if (3 < (int)(local_44 & local_48)) {
        __assert_fail("(Res0 & Res1) <= 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaUnate.c"
                      ,0x87,"int Gia_ManCheckUnate_rec(Gia_Man_t *, int)");
      }
      p_local._4_4_ = p->nTravIds - p->pTravIds[iObj];
    }
    else {
      p_local._4_4_ = 3;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManCheckUnate_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    int Res0, Res1;
    if ( p->nTravIds - p->pTravIds[iObj] <= 3 )
        return p->nTravIds - p->pTravIds[iObj];
    pObj = Gia_ManObj( p, iObj );
    p->pTravIds[iObj] = p->nTravIds - 3;
    if ( Gia_ObjIsCi(pObj) )
        return 3;
    Res0 = Gia_ManCheckUnate_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    Res1 = Gia_ManCheckUnate_rec( p, Gia_ObjFaninId1(pObj, iObj) );
    Res0 = ((Res0 == 1 || Res0 == 2) && Gia_ObjFaninC0(pObj)) ? Res0 ^ 3 : Res0;
    Res1 = ((Res1 == 1 || Res1 == 2) && Gia_ObjFaninC1(pObj)) ? Res1 ^ 3 : Res1;
    p->pTravIds[iObj] = p->nTravIds - (Res0 & Res1);
    assert( (Res0 & Res1) <= 3 );
    return p->nTravIds - p->pTravIds[iObj];
}